

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase152::run(TestCase152 *this)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  bool local_a5;
  unsigned_short local_a2;
  unsigned_short local_a0;
  undefined2 uStack_9e;
  bool _kj_shouldLog_4;
  bool local_9c;
  Bounded<123ul,unsigned_char> local_99;
  uint16_t succ;
  Bounded<1234UL,_unsigned_short> x;
  bool _kj_shouldLog_3;
  bool local_8d;
  uint old;
  Bounded<65535UL,_unsigned_short> succ1_1;
  bool _kj_shouldLog_2;
  Bounded<124UL,_unsigned_int> local_80;
  uint local_7c;
  anon_class_1_0_00000001 local_75;
  Bounded<123UL,_unsigned_int> local_74;
  uint local_70;
  anon_class_1_0_00000001 local_69;
  Bounded<122UL,_unsigned_int> local_68;
  Bounded<4UL,_unsigned_int> local_64;
  Bounded<3UL,_unsigned_int> local_60;
  Bounded<12UL,_unsigned_int> local_5c;
  Bounded<23UL,_unsigned_int> local_58;
  Bounded<100UL,_unsigned_int> local_54;
  Bounded<123UL,_unsigned_int> local_50;
  bool local_49;
  anon_class_8_1_4fa15dba aStack_48;
  bool _kj_shouldLog_1;
  uchar local_3d;
  Bounded<13UL,_unsigned_int> local_3c;
  bool local_38;
  Bounded<12ul,unsigned_char> local_37;
  uchar local_36;
  Type local_35;
  uchar local_34;
  uchar local_33;
  Type local_32;
  uchar local_31;
  bool caught;
  Bounded<12UL,_unsigned_char> bar;
  Bounded<122UL,_unsigned_int> local_2c;
  Bounded<123UL,_unsigned_int> local_28;
  Bounded<123UL,_unsigned_char> local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  bool local_1e;
  anon_class_1_0_00000001 local_1d;
  Bounded<123UL,_unsigned_char> foo;
  Bounded<123UL,_unsigned_char> succ3;
  Bounded<123UL,_unsigned_int> BStack_1c;
  Bounded<123UL,_unsigned_char> succ2;
  Bounded<123UL,_unsigned_char> succ1;
  bool _kj_shouldLog;
  Bounded<456UL,_unsigned_int> local_14;
  TestCase152 *local_10;
  TestCase152 *this_local;
  
  local_10 = this;
  _succ1 = (anonymous_namespace)::boundedValue<456u,unsigned_int>(0x1c8);
  BStack_1c = (anonymous_namespace)::boundedValue<123u,unsigned_int>(0x7b);
  local_14 = Bounded<456UL,_unsigned_int>::
             subtractChecked<123UL,_unsigned_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_units_test_c__:157:3)>
                       ((Bounded<456UL,_unsigned_int> *)&succ1,&stack0xffffffffffffffe4,&local_1d);
  uVar3 = Bounded<456UL,_unsigned_int>::unwrap(&local_14);
  if (uVar3 != 0x14d) {
    local_1e = _::Debug::shouldLog(ERROR);
    while (local_1e != false) {
      _::Debug::log<char_const(&)[104]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0x9d,ERROR,
                 "\"failed: expected \" \"boundedValue<456>().subtractChecked(boundedValue<123>(), [](){}).unwrap() == 456 - 123\""
                 ,(char (*) [104])
                  "failed: expected boundedValue<456>().subtractChecked(boundedValue<123>(), [](){}).unwrap() == 456 - 123"
                );
      local_1e = false;
    }
  }
  local_20 = 0x7b;
  local_21 = 0x7a;
  memset(&local_22,0,1);
  local_28 = (anonymous_namespace)::boundedValue<123u,unsigned_int>(0x7b);
  Bounded<123ul,unsigned_char>::operator=((Bounded<123ul,unsigned_char> *)&local_23,&local_28);
  local_2c = (anonymous_namespace)::boundedValue<122u,unsigned_int>(0x7a);
  Bounded<123ul,unsigned_char>::operator=((Bounded<123ul,unsigned_char> *)&local_23,&local_2c);
  _caught = (anonymous_namespace)::boundedValue<0u,unsigned_int>(0);
  Bounded<123ul,unsigned_char>::operator=
            ((Bounded<123ul,unsigned_char> *)&local_23,(Bounded<0UL,_unsigned_int> *)&caught);
  local_31 = local_23.value;
  local_33 = (uchar)assertMax<122ul,123ul,unsigned_char,kj::(anonymous_namespace)::TestCase152::run()::__1>
                              (local_23,&local_32);
  local_34 = local_23.value;
  local_36 = (uchar)assertMaxBits<6UL,_123UL,_unsigned_char,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_units_test_c__:190:25)>
                              (local_23,&local_35);
  local_38 = false;
  local_3c = (anonymous_namespace)::boundedValue<13u,unsigned_int>(0xd);
  Bounded<123ul,unsigned_char>::operator=((Bounded<123ul,unsigned_char> *)&local_23,&local_3c);
  aStack_48.caught = &local_38;
  local_3d = (uchar)Bounded<123ul,unsigned_char>::
                    assertMax<12ul,kj::(anonymous_namespace)::TestCase152::run()::__3>
                              ((Bounded<123ul,unsigned_char> *)&local_23,&stack0xffffffffffffffb8);
  local_37 = (Bounded<12ul,unsigned_char>)local_3d;
  if ((local_38 & 1U) == 0) {
    local_49 = _::Debug::shouldLog(ERROR);
    while (local_49 != false) {
      _::Debug::log<char_const(&)[24]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,200,ERROR,"\"failed: expected \" \"caught\"",
                 (char (*) [24])"failed: expected caught");
      local_49 = false;
    }
  }
  local_54 = (anonymous_namespace)::boundedValue<100u,unsigned_int>(100);
  local_58 = (anonymous_namespace)::boundedValue<23u,unsigned_int>(0x17);
  local_50 = Bounded<100UL,_unsigned_int>::operator+<23UL,_unsigned_int>(&local_54,&local_58);
  Bounded<123ul,unsigned_char>::operator=((Bounded<123ul,unsigned_char> *)&local_23,&local_50);
  local_60 = (anonymous_namespace)::boundedValue<3u,unsigned_int>(3);
  local_64 = (anonymous_namespace)::boundedValue<4u,unsigned_int>(4);
  local_5c = Bounded<3UL,_unsigned_int>::operator*<4UL,_unsigned_int>(&local_60,&local_64);
  Bounded<12ul,unsigned_char>::operator=(&local_37,&local_5c);
  local_68 = (anonymous_namespace)::boundedValue<122u,unsigned_int>(0x7a);
  local_70 = (uint)Bounded<123UL,_unsigned_char>::
                   subtractChecked<122UL,_unsigned_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_units_test_c__:208:44)>
                             (&local_23,&local_68,&local_69);
  local_74 = (anonymous_namespace)::boundedValue<123u,unsigned_int>(0x7b);
  local_7c = (uint)Bounded<123UL,_unsigned_char>::
                   subtractChecked<123UL,_unsigned_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_units_test_c__:209:44)>
                             (&local_23,&local_74,&local_75);
  local_38 = false;
  local_80 = (anonymous_namespace)::boundedValue<124u,unsigned_int>(0x7c);
  _succ1_1 = &local_38;
  Bounded<123UL,_unsigned_char>::
  subtractChecked<124UL,_unsigned_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_units_test_c__:211:44)>
            (&local_23,&local_80,(anon_class_8_1_4fa15dba *)&succ1_1);
  if ((local_38 & 1U) == 0) {
    local_8d = _::Debug::shouldLog(ERROR);
    while (local_8d != false) {
      _::Debug::log<char_const(&)[24]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xd4,ERROR,"\"failed: expected \" \"caught\"",
                 (char (*) [24])"failed: expected caught");
      local_8d = false;
    }
  }
  uVar1 = Bounded<123UL,_unsigned_char>::unwrap(&local_23);
  local_99 = (Bounded<123ul,unsigned_char>)local_23.value;
  unit<kj::Bounded<123ul,unsigned_char>>();
  _succ = operator*<123UL,_1U,_unsigned_char>(local_99);
  Bounded<123ul,unsigned_char>::operator=
            ((Bounded<123ul,unsigned_char> *)&local_23,(Bounded<123UL,_unsigned_int> *)&succ);
  uVar2 = Bounded<123UL,_unsigned_char>::unwrap(&local_23);
  if (uVar2 != uVar1) {
    local_9c = _::Debug::shouldLog(ERROR);
    while (local_9c != false) {
      _::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xdd,ERROR,"\"failed: expected \" \"foo.unwrap() == old\"",
                 (char (*) [37])"failed: expected foo.unwrap() == old");
      local_9c = false;
    }
  }
  uStack_9e = 0x7b;
  local_a2 = (unsigned_short)unbound<1234ul,unsigned_short>((Bounded<1234UL,_unsigned_short>)0x7b);
  local_a0 = SafeUnwrapper::operator_cast_to_unsigned_short((SafeUnwrapper *)&local_a2);
  if (local_a0 != 0x7b) {
    local_a5 = _::Debug::shouldLog(ERROR);
    while (local_a5 != false) {
      _::Debug::log<char_const(&)[29]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xe2,ERROR,"\"failed: expected \" \"succ == 123\"",
                 (char (*) [29])"failed: expected succ == 123");
      local_a5 = false;
    }
  }
  return;
}

Assistant:

TEST(AsyncIo, OneWayPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newOneWayPipe();
  char receiveBuffer[4];

  pipe.out->write("foo", 3).detach([](kj::Exception&& exception) {
    KJ_FAIL_EXPECT(exception);
  });

  kj::String result = pipe.in->tryRead(receiveBuffer, 3, 4).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer, n);
  }).wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
}